

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>::~ModeState
          (ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *this)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  ColumnDataScanState *this_01;
  pointer puVar1;
  pointer pFVar2;
  
  this_00 = &this->frequency_map->_M_h;
  if (this_00 !=
      (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(this_00);
    operator_delete(this_00);
  }
  if (this->mode != (uint *)0x0) {
    operator_delete(this->mode);
  }
  this_01 = this->scan;
  if (this_01 != (ColumnDataScanState *)0x0) {
    puVar1 = (this_01->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this_01);
    operator_delete(this_01);
  }
  DataChunk::~DataChunk(&this->page);
  pFVar2 = (this->prevs).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2);
    return;
  }
  return;
}

Assistant:

~ModeState() {
		if (frequency_map) {
			delete frequency_map;
		}
		if (mode) {
			delete mode;
		}
		if (scan) {
			delete scan;
		}
	}